

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskBuilder.cpp
# Opt level: O2

int __thiscall
DiskBuilder::SaveDisk
          (DiskBuilder *this,char *file_path,IDisk *disk,char *format,
          ILoadingProgress *loading_progress)

{
  int iVar1;
  undefined4 extraout_var;
  pointer ppFVar2;
  
  ppFVar2 = (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppFVar2 ==
        (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      return -1;
    }
    iVar1 = (**(*ppFVar2)->_vptr_FormatType)();
    iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),format);
    if (iVar1 == 0) break;
    ppFVar2 = ppFVar2 + 1;
  }
  iVar1 = (*(*ppFVar2)->_vptr_FormatType[9])(*ppFVar2,file_path,disk,loading_progress);
  return iVar1;
}

Assistant:

int DiskBuilder::SaveDisk(const char* file_path, IDisk* disk, const char* format, ILoadingProgress* loading_progress)
{
   for (auto it = format_list_.begin(); it != format_list_.end(); it++)
   {
      if (strcmp((*it)->GetFormatName(), format) == 0)
      {
         return (*it)->SaveDisk(file_path, disk, loading_progress);;
      }
   }
   return -1;
}